

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
xlfparser::Token::value<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Token *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *string)

{
  ulong uVar1;
  size_type __pos;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar1 = this->m_end;
  if ((uVar1 < string->_M_string_length) && (__pos = this->m_start, __pos <= uVar1)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (__return_storage_ptr__,string,__pos,(uVar1 - __pos) + 1);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Token index out of range","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_0011dd38;
  __cxa_throw(this_00,&invalid_token::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

string_type value(const string_type& string) const
        {
            if (m_end >= string.size() || m_start > m_end)
                throw invalid_token("Token index out of range");

            return string.substr(m_start, m_end + 1 - m_start);
        }